

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O2

idx_t duckdb::TernaryExecutor::
      Select<unsigned_char,unsigned_char,unsigned_char,duckdb::BothInclusiveBetweenOperator>
                (Vector *a,Vector *b,Vector *c,SelectionVector *sel,idx_t count,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  idx_t iVar1;
  UnifiedVectorFormat cdata;
  UnifiedVectorFormat bdata;
  UnifiedVectorFormat adata;
  UnifiedVectorFormat local_108;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  if (sel == (SelectionVector *)0x0) {
    sel = FlatVector::IncrementalSelectionVector();
  }
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_108);
  Vector::ToUnifiedFormat(a,count,&local_78);
  Vector::ToUnifiedFormat(b,count,&local_c0);
  Vector::ToUnifiedFormat(c,count,&local_108);
  iVar1 = SelectLoopSwitch<unsigned_char,unsigned_char,unsigned_char,duckdb::BothInclusiveBetweenOperator>
                    (&local_78,&local_c0,&local_108,sel,count,true_sel,false_sel);
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_108);
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_c0);
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  return iVar1;
}

Assistant:

static idx_t Select(Vector &a, Vector &b, Vector &c, const SelectionVector *sel, idx_t count,
	                    SelectionVector *true_sel, SelectionVector *false_sel) {
		if (!sel) {
			sel = FlatVector::IncrementalSelectionVector();
		}
		UnifiedVectorFormat adata, bdata, cdata;
		a.ToUnifiedFormat(count, adata);
		b.ToUnifiedFormat(count, bdata);
		c.ToUnifiedFormat(count, cdata);

		return SelectLoopSwitch<A_TYPE, B_TYPE, C_TYPE, OP>(adata, bdata, cdata, sel, count, true_sel, false_sel);
	}